

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::ReadAutogenInfoFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory,string *config)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  reference pbVar6;
  mapped_type *pmVar7;
  reference pbVar8;
  mapped_type *this_00;
  char *local_990;
  char *local_8e0;
  char *local_8c0;
  allocator local_739;
  string local_738;
  string local_718;
  undefined1 local_6f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccInputFiles;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d8;
  iterator inputIt;
  iterator fileIt_2;
  string local_6c0;
  undefined1 local_6a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccInputLists;
  string local_680;
  char *local_660;
  char *rccInputs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_650;
  iterator optionIt_1;
  iterator fileIt_1;
  string local_638;
  undefined1 local_618 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsVec;
  string local_5f8;
  undefined1 local_5d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFilesVec;
  string local_5b8;
  char *local_598;
  char *rccOptionsOptions;
  string local_588;
  char *local_568;
  char *rccOptionsFiles;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_558;
  iterator optionIt;
  iterator fileIt;
  string local_540;
  undefined1 local_520 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicOptionsVec;
  string local_500;
  undefined1 local_4e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicFilesVec;
  string local_4c0;
  char *local_4a0;
  char *uicOptionsOptions;
  string local_490;
  char *local_470;
  char *uicTargetOptions;
  string uicOptionsProp;
  undefined1 local_440 [8];
  string uicOptionsPropOrig;
  string local_418;
  char *local_3f8;
  char *uicOptionsFiles;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  char *local_328;
  char *includes;
  string includesProp;
  undefined1 local_2f8 [8];
  string includesPropOrig;
  char *compileDefs;
  string compileDefsProp;
  undefined1 local_2a8 [8];
  string compileDefsPropOrig;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_11a;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  string rccSources;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  int local_60;
  undefined1 local_50 [8];
  string filename;
  string *config_local;
  string *targetDirectory_local;
  cmMakefile *makefile_local;
  cmQtAutoGenerators *this_local;
  
  filename.field_2._8_8_ = config;
  cmsys::SystemTools::CollapseFullPath((string *)local_50,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_50);
  std::__cxx11::string::operator+=((string *)local_50,"/AutogenInfo.cmake");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmMakefile::ReadListFile(makefile,pcVar2);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"AM_QT_VERSION_MAJOR",&local_81);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_80);
    std::__cxx11::string::operator=((string *)this,pcVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    bVar1 = std::operator==(&this->QtMajorVersion,"");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"AM_Qt5Core_VERSION_MAJOR",&local_a9);
      pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_a8);
      std::__cxx11::string::operator=((string *)this,pcVar2);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,"AM_SOURCES",(allocator *)(rccSources.field_2._M_local_buf + 0xf)
              );
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_d0);
    std::__cxx11::string::operator=((string *)&this->Sources,pcVar2);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(rccSources.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"AM_RCC_SOURCES",&local_119);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f8,pcVar2,&local_11a);
    std::allocator<char>::~allocator((allocator<char> *)&local_11a);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    cmSystemTools::ExpandListArgument((string *)local_f8,&this->RccSources,false);
    std::__cxx11::string::~string((string *)local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"AM_SKIP_MOC",&local_141);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_140);
    std::__cxx11::string::operator=((string *)&this->SkipMoc,pcVar2);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"AM_SKIP_UIC",&local_169);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_168);
    std::__cxx11::string::operator=((string *)&this->SkipUic,pcVar2);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"AM_HEADERS",&local_191);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_190);
    std::__cxx11::string::operator=((string *)&this->Headers,pcVar2);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1b8,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",&local_1b9);
    bVar1 = cmMakefile::IsOn(makefile,&local_1b8);
    this->IncludeProjectDirsBefore = bVar1;
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"AM_CMAKE_CURRENT_SOURCE_DIR",&local_1e1);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_1e0);
    std::__cxx11::string::operator=((string *)&this->Srcdir,pcVar2);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"AM_CMAKE_CURRENT_BINARY_DIR",&local_209);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_208);
    std::__cxx11::string::operator=((string *)&this->Builddir,pcVar2);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"AM_QT_MOC_EXECUTABLE",&local_231);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_230);
    std::__cxx11::string::operator=((string *)&this->MocExecutable,pcVar2);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"AM_QT_UIC_EXECUTABLE",&local_259);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_258);
    std::__cxx11::string::operator=((string *)&this->UicExecutable,pcVar2);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_280,"AM_QT_RCC_EXECUTABLE",
               (allocator *)(compileDefsPropOrig.field_2._M_local_buf + 0xf));
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_280);
    std::__cxx11::string::operator=((string *)&this->RccExecutable,pcVar2);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator
              ((allocator<char> *)(compileDefsPropOrig.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2a8,"AM_MOC_COMPILE_DEFINITIONS",
               (allocator *)(compileDefsProp.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(compileDefsProp.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&compileDefs,(string *)local_2a8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&compileDefs,"_");
      std::__cxx11::string::operator+=((string *)&compileDefs,(string *)filename.field_2._8_8_);
    }
    local_8c0 = cmMakefile::GetDefinition(makefile,(string *)&compileDefs);
    includesPropOrig.field_2._8_8_ = local_8c0;
    if (local_8c0 == (char *)0x0) {
      local_8c0 = cmMakefile::GetSafeDefinition(makefile,(string *)local_2a8);
    }
    std::__cxx11::string::operator=((string *)&this->MocCompileDefinitionsStr,local_8c0);
    std::__cxx11::string::~string((string *)&compileDefs);
    std::__cxx11::string::~string((string *)local_2a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2f8,"AM_MOC_INCLUDES",
               (allocator *)(includesProp.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(includesProp.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&includes,(string *)local_2f8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&includes,"_");
      std::__cxx11::string::operator+=((string *)&includes,(string *)filename.field_2._8_8_);
    }
    local_8e0 = cmMakefile::GetDefinition(makefile,(string *)&includes);
    local_328 = local_8e0;
    if (local_8e0 == (char *)0x0) {
      local_8e0 = cmMakefile::GetSafeDefinition(makefile,(string *)local_2f8);
    }
    std::__cxx11::string::operator=((string *)&this->MocIncludesStr,local_8e0);
    std::__cxx11::string::~string((string *)&includes);
    std::__cxx11::string::~string((string *)local_2f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_348,"AM_MOC_OPTIONS",&local_349);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_348);
    std::__cxx11::string::operator=((string *)&this->MocOptionsStr,pcVar2);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_370,"AM_CMAKE_BINARY_DIR",&local_371);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_370);
    std::__cxx11::string::operator=((string *)&this->ProjectBinaryDir,pcVar2);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,"AM_CMAKE_SOURCE_DIR",&local_399);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_398);
    std::__cxx11::string::operator=((string *)&this->ProjectSourceDir,pcVar2);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c0,"AM_TARGET_NAME",&local_3c1);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_3c0);
    std::__cxx11::string::operator=((string *)&this->TargetName,pcVar2);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3e8,"AM_ORIGIN_TARGET_NAME",
               (allocator *)((long)&uicOptionsFiles + 7));
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_3e8);
    std::__cxx11::string::operator=((string *)&this->OriginTargetName,pcVar2);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&uicOptionsFiles + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_418,"AM_UIC_OPTIONS_FILES",
               (allocator *)(uicOptionsPropOrig.field_2._M_local_buf + 0xf));
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator
              ((allocator<char> *)(uicOptionsPropOrig.field_2._M_local_buf + 0xf));
    local_3f8 = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_440,"AM_UIC_TARGET_OPTIONS",
               (allocator *)(uicOptionsProp.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(uicOptionsProp.field_2._M_local_buf + 0xf))
    ;
    std::__cxx11::string::string((string *)&uicTargetOptions,(string *)local_440);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&uicTargetOptions,"_");
      std::__cxx11::string::operator+=((string *)&uicTargetOptions,(string *)filename.field_2._8_8_)
      ;
    }
    local_990 = cmMakefile::GetSafeDefinition(makefile,(string *)&uicTargetOptions);
    local_470 = local_990;
    if (local_990 == (char *)0x0) {
      local_990 = cmMakefile::GetSafeDefinition(makefile,(string *)local_440);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_490,local_990,(allocator *)((long)&uicOptionsOptions + 7));
    cmSystemTools::ExpandListArgument(&local_490,&this->UicTargetOptions,false);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)((long)&uicOptionsOptions + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4c0,"AM_UIC_OPTIONS_OPTIONS",
               (allocator *)
               ((long)&uicFilesVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uicFilesVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_4a0 = pcVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4e0);
    pcVar2 = local_3f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_500,pcVar2,
               (allocator *)
               ((long)&uicOptionsVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmSystemTools::ExpandListArgument
              (&local_500,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4e0,false);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uicOptionsVec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_520);
    pcVar2 = local_4a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_540,pcVar2,(allocator *)((long)&fileIt._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_540,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_520,false);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 7));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4e0);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_520);
    if (sVar4 == sVar5) {
      optionIt = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_4e0);
      local_558._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_520);
      while( true ) {
        rccOptionsFiles =
             (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_4e0);
        bVar1 = __gnu_cxx::operator!=
                          (&optionIt,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&rccOptionsFiles);
        if (!bVar1) break;
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_558);
        cmsys::SystemTools::ReplaceString(pbVar8,"@list_sep@",";");
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_558);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&optionIt);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->UicOptions,pbVar6);
        std::__cxx11::string::operator=((string *)pmVar7,(string *)pbVar8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&optionIt);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_558);
      }
      local_60 = 0;
    }
    else {
      this_local._7_1_ = 0;
      local_60 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_520);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4e0);
    std::__cxx11::string::~string((string *)&uicTargetOptions);
    std::__cxx11::string::~string((string *)local_440);
    if (local_60 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_588,"AM_RCC_OPTIONS_FILES",
                 (allocator *)((long)&rccOptionsOptions + 7));
      pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rccOptionsOptions + 7));
      local_568 = pcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5b8,"AM_RCC_OPTIONS_OPTIONS",
                 (allocator *)
                 ((long)&rccFilesVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rccFilesVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_598 = pcVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5d8);
      pcVar2 = local_568;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5f8,pcVar2,
                 (allocator *)
                 ((long)&rccOptionsVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmSystemTools::ExpandListArgument
                (&local_5f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5d8,false);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rccOptionsVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_618);
      pcVar2 = local_598;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_638,pcVar2,(allocator *)((long)&fileIt_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_638,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_618,false);
      std::__cxx11::string::~string((string *)&local_638);
      std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt_1._M_current + 7));
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5d8);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_618);
      if (sVar4 == sVar5) {
        optionIt_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_5d8);
        local_650._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_618);
        while( true ) {
          rccInputs = (char *)std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_5d8);
          bVar1 = __gnu_cxx::operator!=
                            (&optionIt_1,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&rccInputs);
          if (!bVar1) break;
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_650);
          cmsys::SystemTools::ReplaceString(pbVar8,"@list_sep@",";");
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_650);
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&optionIt_1);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->RccOptions,pbVar6);
          std::__cxx11::string::operator=((string *)pmVar7,(string *)pbVar8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&optionIt_1);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_650);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_680,"AM_RCC_INPUTS",
                   (allocator *)
                   ((long)&rccInputLists.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_680);
        std::__cxx11::string::~string((string *)&local_680);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&rccInputLists.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_660 = pcVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6a0);
        pcVar2 = local_660;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_6c0,pcVar2,(allocator *)((long)&fileIt_2._M_current + 7));
        cmSystemTools::ExpandListArgument
                  (&local_6c0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_6a0,false);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt_2._M_current + 7));
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->RccSources);
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_6a0);
        if (sVar4 == sVar5) {
          inputIt = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&this->RccSources);
          local_6d8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_6a0);
          while( true ) {
            rccInputFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end(&this->RccSources);
            bVar1 = __gnu_cxx::operator!=
                              (&inputIt,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&rccInputFiles.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (!bVar1) break;
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_6d8);
            cmsys::SystemTools::ReplaceString(pbVar8,"@list_sep@",";");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_6f8);
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_6d8);
            cmSystemTools::ExpandListArgument
                      (pbVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6f8,false);
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&inputIt);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&this->RccInputs,pbVar8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6f8);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&inputIt);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_6d8);
          }
          local_60 = 0;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("Error processing file: ",pcVar2,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          local_60 = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6a0);
      }
      else {
        this_local._7_1_ = 0;
        local_60 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_618);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5d8);
      if (local_60 == 0) {
        MakeCompileSettingsString_abi_cxx11_(&local_718,this,makefile);
        std::__cxx11::string::operator=
                  ((string *)&this->CurrentCompileSettingsStr,(string *)&local_718);
        std::__cxx11::string::~string((string *)&local_718);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_738,"AM_RELAXED_MODE",&local_739);
        bVar1 = cmMakefile::IsOn(makefile,&local_738);
        this->RelaxedMode = bVar1;
        std::__cxx11::string::~string((string *)&local_738);
        std::allocator<char>::~allocator((allocator<char> *)&local_739);
        this_local._7_1_ = 1;
        local_60 = 1;
      }
    }
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Error processing file: ",pcVar2,(char *)0x0,(char *)0x0);
    this_local._7_1_ = 0;
    local_60 = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerators::ReadAutogenInfoFile(cmMakefile* makefile,
                                      const std::string& targetDirectory,
                                      const std::string& config)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutogenInfo.cmake";

  if (!makefile->ReadListFile(filename.c_str()))
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  this->QtMajorVersion = makefile->GetSafeDefinition("AM_QT_VERSION_MAJOR");
  if (this->QtMajorVersion == "")
    {
    this->QtMajorVersion = makefile->GetSafeDefinition(
                                     "AM_Qt5Core_VERSION_MAJOR");
    }
  this->Sources = makefile->GetSafeDefinition("AM_SOURCES");
  {
  std::string rccSources = makefile->GetSafeDefinition("AM_RCC_SOURCES");
  cmSystemTools::ExpandListArgument(rccSources, this->RccSources);
  }
  this->SkipMoc = makefile->GetSafeDefinition("AM_SKIP_MOC");
  this->SkipUic = makefile->GetSafeDefinition("AM_SKIP_UIC");
  this->Headers = makefile->GetSafeDefinition("AM_HEADERS");
  this->IncludeProjectDirsBefore = makefile->IsOn(
                                "AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
  this->Srcdir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_SOURCE_DIR");
  this->Builddir = makefile->GetSafeDefinition("AM_CMAKE_CURRENT_BINARY_DIR");
  this->MocExecutable = makefile->GetSafeDefinition("AM_QT_MOC_EXECUTABLE");
  this->UicExecutable = makefile->GetSafeDefinition("AM_QT_UIC_EXECUTABLE");
  this->RccExecutable = makefile->GetSafeDefinition("AM_QT_RCC_EXECUTABLE");
  {
  std::string compileDefsPropOrig = "AM_MOC_COMPILE_DEFINITIONS";
  std::string compileDefsProp = compileDefsPropOrig;
  if(!config.empty())
    {
    compileDefsProp += "_";
    compileDefsProp += config;
    }
  const char *compileDefs = makefile->GetDefinition(compileDefsProp);
  this->MocCompileDefinitionsStr = compileDefs ? compileDefs
                  : makefile->GetSafeDefinition(compileDefsPropOrig);
  }
  {
  std::string includesPropOrig = "AM_MOC_INCLUDES";
  std::string includesProp = includesPropOrig;
  if(!config.empty())
    {
    includesProp += "_";
    includesProp += config;
    }
  const char *includes = makefile->GetDefinition(includesProp);
  this->MocIncludesStr = includes ? includes
                      : makefile->GetSafeDefinition(includesPropOrig);
  }
  this->MocOptionsStr = makefile->GetSafeDefinition("AM_MOC_OPTIONS");
  this->ProjectBinaryDir = makefile->GetSafeDefinition("AM_CMAKE_BINARY_DIR");
  this->ProjectSourceDir = makefile->GetSafeDefinition("AM_CMAKE_SOURCE_DIR");
  this->TargetName = makefile->GetSafeDefinition("AM_TARGET_NAME");
  this->OriginTargetName
                      = makefile->GetSafeDefinition("AM_ORIGIN_TARGET_NAME");

  {
  const char *uicOptionsFiles
                        = makefile->GetSafeDefinition("AM_UIC_OPTIONS_FILES");
  std::string uicOptionsPropOrig = "AM_UIC_TARGET_OPTIONS";
  std::string uicOptionsProp = uicOptionsPropOrig;
  if(!config.empty())
    {
    uicOptionsProp += "_";
    uicOptionsProp += config;
    }
  const char *uicTargetOptions
                        = makefile->GetSafeDefinition(uicOptionsProp);
  cmSystemTools::ExpandListArgument(
      uicTargetOptions ? uicTargetOptions
                    : makefile->GetSafeDefinition(uicOptionsPropOrig),
    this->UicTargetOptions);
  const char *uicOptionsOptions
                      = makefile->GetSafeDefinition("AM_UIC_OPTIONS_OPTIONS");
  std::vector<std::string> uicFilesVec;
  cmSystemTools::ExpandListArgument(uicOptionsFiles, uicFilesVec);
  std::vector<std::string> uicOptionsVec;
  cmSystemTools::ExpandListArgument(uicOptionsOptions, uicOptionsVec);
  if (uicFilesVec.size() != uicOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = uicFilesVec.begin(),
                                            optionIt = uicOptionsVec.begin();
                                            fileIt != uicFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->UicOptions[*fileIt] = *optionIt;
    }
  }
  {
  const char *rccOptionsFiles
                        = makefile->GetSafeDefinition("AM_RCC_OPTIONS_FILES");
  const char *rccOptionsOptions
                      = makefile->GetSafeDefinition("AM_RCC_OPTIONS_OPTIONS");
  std::vector<std::string> rccFilesVec;
  cmSystemTools::ExpandListArgument(rccOptionsFiles, rccFilesVec);
  std::vector<std::string> rccOptionsVec;
  cmSystemTools::ExpandListArgument(rccOptionsOptions, rccOptionsVec);
  if (rccFilesVec.size() != rccOptionsVec.size())
    {
    return false;
    }
  for (std::vector<std::string>::iterator fileIt = rccFilesVec.begin(),
                                            optionIt = rccOptionsVec.begin();
                                            fileIt != rccFilesVec.end();
                                            ++fileIt, ++optionIt)
    {
    cmSystemTools::ReplaceString(*optionIt, "@list_sep@", ";");
    this->RccOptions[*fileIt] = *optionIt;
    }

  const char *rccInputs = makefile->GetSafeDefinition("AM_RCC_INPUTS");
  std::vector<std::string> rccInputLists;
  cmSystemTools::ExpandListArgument(rccInputs, rccInputLists);

  if (this->RccSources.size() != rccInputLists.size())
    {
    cmSystemTools::Error("Error processing file: ", filename.c_str());
    return false;
    }

  for (std::vector<std::string>::iterator fileIt = this->RccSources.begin(),
                                            inputIt = rccInputLists.begin();
                                            fileIt != this->RccSources.end();
                                            ++fileIt, ++inputIt)
    {
    cmSystemTools::ReplaceString(*inputIt, "@list_sep@", ";");
    std::vector<std::string> rccInputFiles;
    cmSystemTools::ExpandListArgument(*inputIt, rccInputFiles);

    this->RccInputs[*fileIt] = rccInputFiles;
    }
  }
  this->CurrentCompileSettingsStr = this->MakeCompileSettingsString(makefile);

  this->RelaxedMode = makefile->IsOn("AM_RELAXED_MODE");

  return true;
}